

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>>,fmt::v8::detail::error_handler>
              (void)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  custom_value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
  custom;
  ulong uVar1;
  int value_04;
  type tVar2;
  byte bStack0000000000000008;
  undefined1 uStack0000000000000009;
  undefined2 uStack000000000000000a;
  undefined4 uStack000000000000000c;
  undefined2 arg;
  undefined6 uStack0000000000000012;
  undefined4 in_stack_00000018;
  unkbyte10 in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee2;
  precision_checker<fmt::v8::detail::error_handler> local_d0;
  ulong local_c8;
  unsigned_long_long value;
  undefined8 local_b8;
  undefined8 local_b0;
  custom_value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
  local_a8;
  basic_string_view<char16_t> local_98;
  unsigned___int128 *local_88;
  unsigned___int128 *local_78;
  unsigned___int128 *local_68;
  detail *local_60;
  __int128 *local_58;
  __int128 *local_48;
  __int128 *local_38;
  undefined8 local_30;
  undefined8 *local_20;
  precision_checker<fmt::v8::detail::error_handler> *local_18;
  ulong local_10;
  
  precision_checker<fmt::v8::detail::error_handler>::precision_checker
            (&local_d0,(error_handler *)((long)&value + 6));
  local_20 = (undefined8 *)&stack0x00000008;
  local_18 = &local_d0;
  switch(in_stack_00000018) {
  case 0:
  default:
    monostate::monostate((monostate *)((long)&value + 7));
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<fmt::v8::monostate,_0>
                         (&local_d0);
    break;
  case 1:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<int,_0>
                         (&local_d0,
                          CONCAT22(uStack000000000000000a,
                                   CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    break;
  case 2:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<unsigned_int,_0>
                         (&local_d0,
                          CONCAT22(uStack000000000000000a,
                                   CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    break;
  case 3:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<long_long,_0>
                         (&local_d0,
                          CONCAT44(uStack000000000000000c,
                                   CONCAT22(uStack000000000000000a,
                                            CONCAT11(uStack0000000000000009,bStack0000000000000008))
                                  ));
    break;
  case 4:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<unsigned_long_long,_0>
                         (&local_d0,
                          CONCAT44(uStack000000000000000c,
                                   CONCAT22(uStack000000000000000a,
                                            CONCAT11(uStack0000000000000009,bStack0000000000000008))
                                  ));
    break;
  case 5:
    local_38 = (__int128 *)
               CONCAT44(uStack000000000000000c,
                        CONCAT22(uStack000000000000000a,
                                 CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    local_30 = CONCAT62(uStack0000000000000012,arg);
    value_00._10_6_ = in_stack_fffffffffffffee2;
    value_00._0_10_ = in_stack_fffffffffffffed8;
    local_58 = convert_for_visit<__int128>(local_38,(__int128)value_00);
    value_01._10_6_ = in_stack_fffffffffffffee2;
    value_01._0_10_ = in_stack_fffffffffffffed8;
    local_48 = local_58;
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<__int128,_0>
                         (&local_d0,(__int128)value_01);
    break;
  case 6:
    local_68 = (unsigned___int128 *)
               CONCAT44(uStack000000000000000c,
                        CONCAT22(uStack000000000000000a,
                                 CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    local_60 = (detail *)CONCAT62(uStack0000000000000012,arg);
    value_02._10_6_ = in_stack_fffffffffffffee2;
    value_02._0_10_ = in_stack_fffffffffffffed8;
    local_88 = convert_for_visit<unsigned__int128>(local_68,local_60,(unsigned___int128)value_02);
    value_03._10_6_ = in_stack_fffffffffffffee2;
    value_03._0_10_ = in_stack_fffffffffffffed8;
    local_78 = local_88;
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<unsigned___int128,_0>
                         (&local_d0,(unsigned___int128)value_03);
    break;
  case 7:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<bool,_0>
                         (&local_d0,(bool)(bStack0000000000000008 & 1));
    break;
  case 8:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<char16_t,_0>
                         (&local_d0,CONCAT11(uStack0000000000000009,bStack0000000000000008));
    break;
  case 9:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<float,_0>
                         (&local_d0,
                          (float)CONCAT22(uStack000000000000000a,
                                          CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    break;
  case 10:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<double,_0>
                         (&local_d0,
                          (double)CONCAT44(uStack000000000000000c,
                                           CONCAT22(uStack000000000000000a,
                                                    CONCAT11(uStack0000000000000009,
                                                             bStack0000000000000008))));
    break;
  case 0xb:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<long_double,_0>
                         (&local_d0,
                          (longdouble)
                          CONCAT28(arg,CONCAT44(uStack000000000000000c,
                                                CONCAT22(uStack000000000000000a,
                                                         CONCAT11(uStack0000000000000009,
                                                                  bStack0000000000000008)))));
    break;
  case 0xc:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<const_char16_t_*,_0>
                         (&local_d0,
                          (char16_t *)
                          CONCAT44(uStack000000000000000c,
                                   CONCAT22(uStack000000000000000a,
                                            CONCAT11(uStack0000000000000009,bStack0000000000000008))
                                  ));
    break;
  case 0xd:
    basic_string_view<char16_t>::basic_string_view
              (&local_98,
               (char16_t *)
               CONCAT44(uStack000000000000000c,
                        CONCAT22(uStack000000000000000a,
                                 CONCAT11(uStack0000000000000009,bStack0000000000000008))),
               CONCAT62(uStack0000000000000012,arg));
    local_10 = precision_checker<fmt::v8::detail::error_handler>::
               operator()<fmt::v8::basic_string_view<char16_t>,_0>(&local_d0,local_98);
    break;
  case 0xe:
    local_10 = precision_checker<fmt::v8::detail::error_handler>::operator()<const_void_*,_0>
                         (&local_d0,
                          (void *)CONCAT44(uStack000000000000000c,
                                           CONCAT22(uStack000000000000000a,
                                                    CONCAT11(uStack0000000000000009,
                                                             bStack0000000000000008))));
    break;
  case 0xf:
    local_b8 = CONCAT44(uStack000000000000000c,
                        CONCAT22(uStack000000000000000a,
                                 CONCAT11(uStack0000000000000009,bStack0000000000000008)));
    local_b0 = CONCAT62(uStack0000000000000012,arg);
    custom.value._1_1_ = uStack0000000000000009;
    custom.value._0_1_ = bStack0000000000000008;
    custom.value._2_2_ = uStack000000000000000a;
    custom.value._4_4_ = uStack000000000000000c;
    custom.format._0_2_ = arg;
    custom.format._2_6_ = uStack0000000000000012;
    basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
    ::handle::handle((handle *)&local_a8,custom);
    local_10 = precision_checker<fmt::v8::detail::error_handler>::
               operator()<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>::handle,_0>
                         (&local_d0,(handle)local_a8);
  }
  uVar1 = local_10;
  local_c8 = local_10;
  value_04 = max_value<int>();
  tVar2 = to_unsigned<int>(value_04);
  if (tVar2 < uVar1) {
    error_handler::on_error((error_handler *)((long)&value + 6),"number is too big");
  }
  return (int)local_c8;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}